

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void accommodateAlienBasis(HighsLpSolverObject *solver_object)

{
  int iVar1;
  HighsInt HVar2;
  reference pvVar3;
  size_type sVar4;
  int *piVar5;
  reference pvVar6;
  undefined8 *in_RDI;
  HighsInt iRow_3;
  HighsInt k;
  HighsInt num_missing;
  HighsInt iVar;
  HighsInt iRow_2;
  HighsInt use_basic_variables;
  HighsInt iRow_1;
  HighsInt iCol_1;
  HighsInt rank_deficiency;
  HFactor factor;
  HighsInt num_basic_variables;
  HighsInt iRow;
  HighsInt iCol;
  vector<int,_std::allocator<int>_> basic_index;
  HighsInt num_col;
  HighsInt num_row;
  HighsOptions *options;
  HighsBasis *basis;
  HighsLp *lp;
  value_type_conflict2 *in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  value_type_conflict2 *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  int iVar7;
  int in_stack_fffffffffffff804;
  int local_7f8;
  int local_7ec;
  int local_7e4;
  undefined4 in_stack_fffffffffffff820;
  int iVar8;
  undefined4 in_stack_fffffffffffff824;
  HighsInt HVar9;
  HighsLogOptions *in_stack_fffffffffffff840;
  HighsInt in_stack_fffffffffffff84c;
  pointer in_stack_fffffffffffff850;
  double in_stack_fffffffffffff858;
  HighsInt *in_stack_fffffffffffff860;
  HighsInt in_stack_fffffffffffff86c;
  HighsSparseMatrix *in_stack_fffffffffffff870;
  HFactor *in_stack_fffffffffffff878;
  HighsTimerClock *in_stack_fffffffffffff8c0;
  HFactor *in_stack_fffffffffffff8c8;
  int local_60;
  int local_5c;
  int local_58;
  int local_44;
  vector<int,_std::allocator<int>_> local_40;
  int local_28;
  int local_24;
  undefined8 local_20;
  long local_18;
  int *local_10;
  
  local_10 = (int *)*in_RDI;
  local_18 = in_RDI[1];
  local_20 = in_RDI[6];
  local_24 = local_10[1];
  local_28 = *local_10;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x528f6a);
  for (local_44 = 0; local_44 < local_28; local_44 = local_44 + 1) {
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (local_18 + 0x30),(long)local_44);
    if (*pvVar3 == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                 in_stack_fffffffffffff7f8);
    }
  }
  for (local_58 = 0; local_58 < local_24; local_58 = local_58 + 1) {
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (local_18 + 0x48),(long)local_58);
    if (*pvVar3 == kBasic) {
      local_5c = local_28 + local_58;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                 in_stack_fffffffffffff7e8);
    }
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_40);
  local_60 = (int)sVar4;
  HFactor::HFactor((HFactor *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
  iVar7 = local_60;
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x5290b1);
  HFactor::setupGeneral
            (in_stack_fffffffffffff878,in_stack_fffffffffffff870,in_stack_fffffffffffff86c,
             in_stack_fffffffffffff860,in_stack_fffffffffffff858,(double)in_stack_fffffffffffff850,
             in_stack_fffffffffffff84c,in_stack_fffffffffffff840);
  HVar2 = HFactor::build(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  HVar9 = HVar2;
  for (iVar8 = 0; iVar8 < local_28; iVar8 = iVar8 + 1) {
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (local_18 + 0x30),(long)iVar8);
    if (*pvVar3 == kBasic) {
      pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_18 + 0x30),(long)iVar8);
      *pvVar3 = kNonbasic;
    }
  }
  for (local_7e4 = 0; local_7e4 < local_24; local_7e4 = local_7e4 + 1) {
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (local_18 + 0x48),(long)local_7e4);
    if (*pvVar3 == kBasic) {
      pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_18 + 0x48),(long)local_7e4);
      *pvVar3 = kNonbasic;
    }
  }
  piVar5 = std::min<int>(&local_24,&local_60);
  iVar8 = *piVar5;
  local_60 = 0;
  for (local_7ec = 0; local_7ec < iVar8; local_7ec = local_7ec + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_7ec);
    iVar1 = *pvVar6;
    if (iVar1 < local_28) {
      pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_18 + 0x30),(long)iVar1);
      *pvVar3 = kBasic;
    }
    else {
      pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_18 + 0x48),(long)(iVar1 - local_28));
      *pvVar3 = kBasic;
    }
    local_60 = local_60 + 1;
  }
  iVar8 = local_24 - local_60;
  for (local_7f8 = 0; local_7f8 < iVar8; local_7f8 = local_7f8 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffff840,
                        (long)(HVar9 + local_7f8));
    in_stack_fffffffffffff804 = *pvVar6;
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (local_18 + 0x48),(long)in_stack_fffffffffffff804);
    *pvVar3 = kBasic;
    local_60 = local_60 + 1;
  }
  HFactor::~HFactor((HFactor *)CONCAT44(HVar2,in_stack_fffffffffffff7f0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffff804,iVar7));
  return;
}

Assistant:

void accommodateAlienBasis(HighsLpSolverObject& solver_object) {
  HighsLp& lp = solver_object.lp_;
  HighsBasis& basis = solver_object.basis_;
  HighsOptions& options = solver_object.options_;
  assert(basis.alien);
  HighsInt num_row = lp.num_row_;
  HighsInt num_col = lp.num_col_;
  assert((int)basis.col_status.size() >= num_col);
  assert((int)basis.row_status.size() >= num_row);
  std::vector<HighsInt> basic_index;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      basic_index.push_back(iCol);
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      basic_index.push_back(num_col + iRow);
  }
  HighsInt num_basic_variables = basic_index.size();
  HFactor factor;
  factor.setupGeneral(&lp.a_matrix_, num_basic_variables, basic_index.data(),
                      kDefaultPivotThreshold, kDefaultPivotTolerance,
                      kHighsDebugLevelMin, &options.log_options);
  HighsInt rank_deficiency = factor.build();
  // Must not have timed out
  assert(rank_deficiency >= 0);
  // Deduce the basis from basic_index
  //
  // Set all basic variables to nonbasic
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      basis.col_status[iCol] = HighsBasisStatus::kNonbasic;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      basis.row_status[iRow] = HighsBasisStatus::kNonbasic;
  }
  // Set at most the first num_row variables in basic_index to basic
  const HighsInt use_basic_variables = std::min(num_row, num_basic_variables);
  // num_basic_variables is no longer needed, so can be used as a check
  num_basic_variables = 0;
  for (HighsInt iRow = 0; iRow < use_basic_variables; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) {
      basis.col_status[iVar] = HighsBasisStatus::kBasic;
    } else {
      basis.row_status[iVar - num_col] = HighsBasisStatus::kBasic;
    }
    num_basic_variables++;
  }
  // Complete the assignment of basic variables using the logicals of
  // non-pivotal rows
  const HighsInt num_missing = num_row - num_basic_variables;
  for (HighsInt k = 0; k < num_missing; k++) {
    HighsInt iRow = factor.row_with_no_pivot[rank_deficiency + k];
    basis.row_status[iRow] = HighsBasisStatus::kBasic;
    num_basic_variables++;
  }
  assert(num_basic_variables == num_row);
}